

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddKeyOriginWithDB
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CPubKey *pubkey,KeyOriginInfo *info)

{
  bool bVar1;
  mapped_type *pmVar2;
  map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
  *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock47;
  CKeyID local_5c;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock47,
             &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x636,false);
  CPubKey::GetID((CKeyID *)&local_48,pubkey);
  this_00 = &(this->super_LegacyDataSPKM).mapKeyMetadata;
  pmVar2 = std::
           map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
           ::operator[](this_00,(key_type *)&local_48);
  *(undefined4 *)(pmVar2->key_origin).fingerprint = *(undefined4 *)info->fingerprint;
  CPubKey::GetID((CKeyID *)&local_48,pubkey);
  pmVar2 = std::
           map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
           ::operator[](this_00,(key_type *)&local_48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&(pmVar2->key_origin).path,&info->path);
  CPubKey::GetID((CKeyID *)&local_48,pubkey);
  pmVar2 = std::
           map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
           ::operator[](this_00,(key_type *)&local_48);
  pmVar2->has_key_origin = true;
  WriteHDKeypath_abi_cxx11_(&local_48,&info->path,true);
  CPubKey::GetID(&local_5c,pubkey);
  pmVar2 = std::
           map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
           ::operator[](this_00,&local_5c);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pmVar2->hdKeypath,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  CPubKey::GetID((CKeyID *)&local_48,pubkey);
  pmVar2 = std::
           map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
           ::operator[](this_00,(key_type *)&local_48);
  bVar1 = WalletBatch::WriteKeyMetadata(batch,pmVar2,pubkey,true);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock47.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::AddKeyOriginWithDB(WalletBatch& batch, const CPubKey& pubkey, const KeyOriginInfo& info)
{
    LOCK(cs_KeyStore);
    std::copy(info.fingerprint, info.fingerprint + 4, mapKeyMetadata[pubkey.GetID()].key_origin.fingerprint);
    mapKeyMetadata[pubkey.GetID()].key_origin.path = info.path;
    mapKeyMetadata[pubkey.GetID()].has_key_origin = true;
    mapKeyMetadata[pubkey.GetID()].hdKeypath = WriteHDKeypath(info.path, /*apostrophe=*/true);
    return batch.WriteKeyMetadata(mapKeyMetadata[pubkey.GetID()], pubkey, true);
}